

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_do_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  _func_int_EVP_CIPHER_CTX_ptr_uchar_ptr_uchar_ptr_size_t *in_RSI;
  uchar *in_RDI;
  EVP_MD_CTX *unaff_retaddr;
  ossl_gost_cipher_ctx *c;
  EVP_CIPHER_CTX *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if ((in_RDX == 0) && (in_RCX == 0)) {
    iVar1 = gost2015_final_call((EVP_CIPHER_CTX *)c,unaff_retaddr,
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,in_RSI);
  }
  else if (in_RDX == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (iVar1 != 0) {
      EVP_DigestSignUpdate(*(undefined8 *)(lVar2 + 0x1080),in_RDX,in_RCX);
    }
    iVar1 = magma_cipher_do_ctr(in_stack_00000030,(uchar *)ctx,out,(size_t)in);
    if (iVar1 == in_RCX) {
      iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
      if (iVar1 == 0) {
        EVP_DigestSignUpdate(*(undefined8 *)(lVar2 + 0x1080),in_RSI,in_RCX);
      }
      iVar1 = (int)in_RCX;
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int magma_cipher_do_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t inl)
{
  struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

	if (in == NULL && inl == 0) /* Final call */
		return gost2015_final_call(ctx, c->omac_ctx, MAGMA_MAC_MAX_SIZE, c->tag, magma_cipher_do_ctr);

  if (in == NULL)
      return -1;

	/* As in and out can be the same pointer, process unencrypted here */
	if (EVP_CIPHER_CTX_encrypting(ctx))
		EVP_DigestSignUpdate(c->omac_ctx, in, inl);

  if (magma_cipher_do_ctr(ctx, out, in, inl) != inl)
      return -1;

	/* As in and out can be the same pointer, process decrypted here */
	if (!EVP_CIPHER_CTX_encrypting(ctx))
		EVP_DigestSignUpdate(c->omac_ctx, out, inl);

	return inl;
}